

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmarkdowntextedit.cpp
# Opt level: O1

void __thiscall
QMarkdownTextEdit::initSearchFrame(QMarkdownTextEdit *this,QWidget *searchFrame,bool darkMode)

{
  QWidget *pQVar1;
  
  this->_searchFrame = searchFrame;
  pQVar1 = (QWidget *)QWidget::layout();
  QLayout::removeWidget(pQVar1);
  pQVar1 = (QWidget *)QWidget::layout();
  if (pQVar1 == (QWidget *)0x0) {
    pQVar1 = (QWidget *)operator_new(0x20);
    QVBoxLayout::QVBoxLayout((QVBoxLayout *)pQVar1,this->_searchFrame);
    (**(code **)(*(long *)pQVar1 + 0x68))(pQVar1);
    QLayout::setContentsMargins((int)pQVar1,0,0,0);
  }
  QPlainTextEditSearchWidget::setDarkMode(this->_searchWidget,darkMode);
  QLayout::addWidget(pQVar1);
  QWidget::setLayout((QLayout *)this->_searchFrame);
  return;
}

Assistant:

void QMarkdownTextEdit::initSearchFrame(QWidget *searchFrame, bool darkMode) {
    _searchFrame = searchFrame;

    // remove the search widget from our layout
    layout()->removeWidget(_searchWidget);

    QLayout *layout = _searchFrame->layout();

    // create a grid layout for the frame and add the search widget to it
    if (layout == nullptr) {
        layout = new QVBoxLayout(_searchFrame);
        layout->setSpacing(0);
        layout->setContentsMargins(0, 0, 0, 0);
    }

    _searchWidget->setDarkMode(darkMode);
    layout->addWidget(_searchWidget);
    _searchFrame->setLayout(layout);
}